

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

timeval google::protobuf::util::TimeUtil::TimestampToTimeval(Timestamp *value)

{
  long lVar1;
  timeval tVar2;
  
  lVar1 = (long)value->nanos_;
  tVar2.tv_usec = lVar1 / 1000 + (ulong)(0 < lVar1 % 1000 && lVar1 < -999);
  tVar2.tv_sec = value->seconds_;
  return tVar2;
}

Assistant:

timeval TimeUtil::TimestampToTimeval(const Timestamp& value) {
  timeval result;
  result.tv_sec = value.seconds();
  result.tv_usec = RoundTowardZero(value.nanos(), kNanosPerMicrosecond);
  return result;
}